

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O2

bool __thiscall
SuperCardPro::SetParameters
          (SuperCardPro *this,int drive_select_delay_us,int step_delay_us,int motor_on_delay_ms,
          int seek_0_delay_ms,int motor_off_delay_ms)

{
  bool bVar1;
  ushort local_a;
  ushort local_8;
  ushort local_6;
  ushort local_4;
  ushort local_2;
  
  local_a = (ushort)drive_select_delay_us << 8 | (ushort)drive_select_delay_us >> 8;
  local_8 = (ushort)step_delay_us << 8 | (ushort)step_delay_us >> 8;
  local_6 = (ushort)motor_on_delay_ms << 8 | (ushort)motor_on_delay_ms >> 8;
  local_4 = (ushort)seek_0_delay_ms << 8 | (ushort)seek_0_delay_ms >> 8;
  local_2 = (ushort)motor_off_delay_ms << 8 | (ushort)motor_off_delay_ms >> 8;
  bVar1 = SendCmd(this,0x91,&local_a,10,(void *)0x0,0);
  return bVar1;
}

Assistant:

bool SuperCardPro::SetParameters(int drive_select_delay_us, int step_delay_us, int motor_on_delay_ms, int seek_0_delay_ms, int motor_off_delay_ms)
{
    uint16_t params[5] = {};

    params[0] = util::betoh(static_cast<uint16_t>(drive_select_delay_us));
    params[1] = util::betoh(static_cast<uint16_t>(step_delay_us));
    params[2] = util::betoh(static_cast<uint16_t>(motor_on_delay_ms));
    params[3] = util::betoh(static_cast<uint16_t>(seek_0_delay_ms));
    params[4] = util::betoh(static_cast<uint16_t>(motor_off_delay_ms));

    return SendCmd(CMD_SETPARAMS, params, sizeof(params));
}